

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_obj.cc
# Opt level: O1

char * X509_NAME_oneline(X509_NAME *a,char *buf,int size)

{
  byte bVar1;
  int *piVar2;
  long lVar3;
  undefined8 uVar4;
  int iVar5;
  BUF_MEM *str;
  undefined4 extraout_var;
  size_t sVar6;
  undefined8 *puVar7;
  char *buf_00;
  size_t sVar8;
  undefined4 extraout_var_00;
  char *pcVar9;
  byte *pbVar10;
  size_t sVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *__dest;
  bool bVar17;
  char tmp_buf [80];
  int local_c8 [4];
  BUF_MEM *local_b8;
  X509_NAME *local_b0;
  char *local_a8;
  size_t local_a0;
  uint local_94;
  ulong local_90;
  char local_88 [88];
  
  local_b0 = a;
  if (buf == (char *)0x0) {
    str = BUF_MEM_new();
    if (str == (BUF_MEM *)0x0) {
      str = (BUF_MEM *)0x0;
    }
    else {
      iVar5 = BUF_MEM_grow(str,200);
      if (CONCAT44(extraout_var,iVar5) != 0) {
        *str->data = '\0';
        size = 200;
        goto LAB_00227151;
      }
    }
LAB_00227444:
    BUF_MEM_free(str);
    buf = (char *)0x0;
  }
  else {
    str = (BUF_MEM *)0x0;
    if (size < 1) {
      return (char *)0x0;
    }
LAB_00227151:
    if (local_b0 == (X509_NAME *)0x0) {
      if (str != (BUF_MEM *)0x0) {
        buf = str->data;
        OPENSSL_free(str);
      }
      OPENSSL_strlcpy(buf,"NO X509_NAME",(ulong)(uint)size);
    }
    else {
      local_b8 = str;
      sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)local_b0->entries);
      if (sVar6 == 0) {
        bVar17 = true;
      }
      else {
        sVar6 = 0;
        uVar15 = 0;
        local_a8 = buf;
        local_94 = size;
        do {
          puVar7 = (undefined8 *)OPENSSL_sk_value((OPENSSL_STACK *)local_b0->entries,sVar6);
          iVar5 = OBJ_obj2nid((ASN1_OBJECT *)*puVar7);
          if ((iVar5 == 0) || (buf_00 = OBJ_nid2sn(iVar5), buf_00 == (char *)0x0)) {
            buf_00 = local_88;
            i2t_ASN1_OBJECT(buf_00,0x50,(ASN1_OBJECT *)*puVar7);
          }
          sVar8 = strlen(buf_00);
          piVar2 = (int *)puVar7[1];
          iVar5 = *piVar2;
          uVar16 = (ulong)iVar5;
          if (0x100000 < (long)uVar16) {
            iVar5 = 0x4f;
LAB_00227411:
            ERR_put_error(0xb,0,0x87,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_obj.cc"
                          ,iVar5);
            str = local_b8;
            goto LAB_00227444;
          }
          lVar3 = *(long *)(piVar2 + 2);
          if (((uVar16 & 3) == 0) && (piVar2[1] == 0x1b)) {
            local_c8[0] = 0;
            local_c8[1] = 0;
            local_c8[2] = 0;
            local_c8[3] = 0;
            uVar4 = local_c8._8_8_;
            local_c8[2] = 0;
            if (0 < iVar5) {
              uVar14 = 0;
              local_c8._8_8_ = uVar4;
              do {
                if (*(char *)(lVar3 + uVar14) != '\0') {
                  local_c8[(uint)uVar14 & 3] = 1;
                }
                uVar14 = uVar14 + 1;
              } while (uVar16 != uVar14);
            }
            if ((local_c8[1] != 0 || local_c8[0] != 0) || local_c8[2] != 0) goto LAB_00227230;
            local_c8[2] = 0;
            local_c8[3] = 1;
            local_c8[0] = 0;
            local_c8[1] = 0;
          }
          else {
LAB_00227230:
            local_c8[2] = 1;
            local_c8[3] = 1;
            local_c8[0] = 1;
            local_c8[1] = 1;
          }
          str = local_b8;
          if (iVar5 < 1) {
            iVar12 = 0;
          }
          else {
            uVar14 = 0;
            iVar12 = 0;
            do {
              if (local_c8[(uint)uVar14 & 3] != 0) {
                iVar12 = iVar12 + (uint)((byte)(*(char *)(lVar3 + uVar14) + 0x81U) < 0xa1) * 3 + 1;
              }
              uVar14 = uVar14 + 1;
            } while (uVar16 != uVar14);
          }
          iVar12 = iVar12 + (int)sVar8 + (int)uVar15;
          uVar13 = iVar12 + 2;
          if (0x100000 < (int)uVar13) {
            iVar5 = 0x73;
            goto LAB_00227411;
          }
          local_a0 = sVar6;
          local_90 = (ulong)uVar13;
          if (local_b8 == (BUF_MEM *)0x0) {
            pcVar9 = local_a8;
            if ((int)local_94 <= (int)uVar13) goto LAB_00227457;
          }
          else {
            iVar12 = BUF_MEM_grow(local_b8,(long)(iVar12 + 3));
            if (CONCAT44(extraout_var_00,iVar12) == 0) goto LAB_00227444;
            pcVar9 = str->data;
          }
          pcVar9 = pcVar9 + (int)uVar15;
          __dest = pcVar9 + 1;
          *pcVar9 = '/';
          if ((sVar8 & 0xffffffff) != 0) {
            memcpy(__dest,buf_00,sVar8 & 0xffffffff);
          }
          pbVar10 = (byte *)(__dest + (int)sVar8 + 1);
          __dest[(int)sVar8] = '=';
          if (0 < iVar5) {
            lVar3 = *(long *)(puVar7[1] + 8);
            uVar15 = 0;
            do {
              if (local_c8[(uint)uVar15 & 3] != 0) {
                bVar1 = *(byte *)(lVar3 + uVar15);
                if ((byte)(bVar1 + 0x81) < 0xa1) {
                  pbVar10[0] = 0x5c;
                  pbVar10[1] = 0x78;
                  pbVar10[2] = "0123456789ABCDEF"[bVar1 >> 4];
                  pbVar10[3] = "0123456789ABCDEF"[bVar1 & 0xf];
                  pbVar10 = pbVar10 + 4;
                }
                else {
                  *pbVar10 = bVar1;
                  pbVar10 = pbVar10 + 1;
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar16 != uVar15);
          }
          *pbVar10 = 0;
          sVar6 = local_a0 + 1;
          sVar11 = OPENSSL_sk_num((OPENSSL_STACK *)local_b0->entries);
          uVar15 = local_90;
        } while (sVar6 < sVar11);
        sVar6 = 1;
LAB_00227457:
        bVar17 = sVar6 == 0;
        buf = local_a8;
      }
      if (local_b8 != (BUF_MEM *)0x0) {
        buf = local_b8->data;
        OPENSSL_free(local_b8);
      }
      if (bVar17) {
        *buf = '\0';
      }
    }
  }
  return buf;
}

Assistant:

char *X509_NAME_oneline(const X509_NAME *a, char *buf, int len) {
  X509_NAME_ENTRY *ne;
  size_t i;
  int n, lold, l, l1, l2, num, j, type;
  const char *s;
  char *p;
  unsigned char *q;
  BUF_MEM *b = NULL;
  static const char hex[17] = "0123456789ABCDEF";
  int gs_doit[4];
  char tmp_buf[80];

  if (buf == NULL) {
    if ((b = BUF_MEM_new()) == NULL) {
      goto err;
    }
    if (!BUF_MEM_grow(b, 200)) {
      goto err;
    }
    b->data[0] = '\0';
    len = 200;
  } else if (len <= 0) {
    return NULL;
  }
  if (a == NULL) {
    if (b) {
      buf = b->data;
      OPENSSL_free(b);
    }
    OPENSSL_strlcpy(buf, "NO X509_NAME", len);
    return buf;
  }

  len--;  // space for '\0'
  l = 0;
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    ne = sk_X509_NAME_ENTRY_value(a->entries, i);
    n = OBJ_obj2nid(ne->object);
    if ((n == NID_undef) || ((s = OBJ_nid2sn(n)) == NULL)) {
      i2t_ASN1_OBJECT(tmp_buf, sizeof(tmp_buf), ne->object);
      s = tmp_buf;
    }
    l1 = strlen(s);

    type = ne->value->type;
    num = ne->value->length;
    if (num > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    q = ne->value->data;

    if ((type == V_ASN1_GENERALSTRING) && ((num % 4) == 0)) {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 0;
      for (j = 0; j < num; j++) {
        if (q[j] != 0) {
          gs_doit[j & 3] = 1;
        }
      }

      if (gs_doit[0] | gs_doit[1] | gs_doit[2]) {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
      } else {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = 0;
        gs_doit[3] = 1;
      }
    } else {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
    }

    for (l2 = j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      l2++;
      if ((q[j] < ' ') || (q[j] > '~')) {
        l2 += 3;
      }
    }

    lold = l;
    l += 1 + l1 + 1 + l2;
    if (l > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    if (b != NULL) {
      if (!BUF_MEM_grow(b, l + 1)) {
        goto err;
      }
      p = &(b->data[lold]);
    } else if (l > len) {
      break;
    } else {
      p = &(buf[lold]);
    }
    *(p++) = '/';
    OPENSSL_memcpy(p, s, (unsigned int)l1);
    p += l1;
    *(p++) = '=';

    q = ne->value->data;

    for (j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      n = q[j];
      if ((n < ' ') || (n > '~')) {
        *(p++) = '\\';
        *(p++) = 'x';
        *(p++) = hex[(n >> 4) & 0x0f];
        *(p++) = hex[n & 0x0f];
      } else {
        *(p++) = n;
      }
    }
    *p = '\0';
  }
  if (b != NULL) {
    p = b->data;
    OPENSSL_free(b);
  } else {
    p = buf;
  }
  if (i == 0) {
    *p = '\0';
  }
  return p;
err:
  BUF_MEM_free(b);
  return NULL;
}